

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::findAndNotifyFilterTargets
          (CoreBroker *this,BasicHandleInfo *handleInfo,string *key)

{
  string_view name;
  string_view name_00;
  bool bVar1;
  undefined1 uVar2;
  uint16_t uVar3;
  BrokerState BVar4;
  UnknownHandleManager *in_RSI;
  ActionMessage *in_RDI;
  CoreBroker *unaff_retaddr;
  unsigned_short flags_1;
  pair<helics::GlobalHandle,_unsigned_short> *target_3;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  *__range2;
  ActionMessage link_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FiltSourceTargets;
  ActionMessage link;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FiltDestTargets;
  unsigned_short flags;
  pair<helics::GlobalHandle,_unsigned_short> *target;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  *__range1;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  Handles;
  string *in_stack_fffffffffffffb98;
  UnknownHandleManager *in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
  in_stack_fffffffffffffbb0;
  InterfaceType type_of_handle;
  uint16_t in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbba;
  undefined1 in_stack_fffffffffffffbbb;
  undefined2 in_stack_fffffffffffffbbc;
  undefined1 in_stack_fffffffffffffbbe;
  undefined1 in_stack_fffffffffffffbbf;
  UnknownHandleManager *in_stack_fffffffffffffbc0;
  __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
  local_350;
  undefined1 *local_348;
  GlobalHandle local_328;
  __sv_type local_320;
  InterfaceHandle in_stack_fffffffffffffcfc;
  BasicHandleInfo *in_stack_fffffffffffffd00;
  uint32_t in_stack_fffffffffffffd0c;
  Time in_stack_fffffffffffffd10;
  Time in_stack_fffffffffffffd18;
  pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
  in_stack_fffffffffffffd20;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_248;
  undefined1 *local_240;
  undefined1 local_238 [24];
  GlobalHandle local_220;
  __sv_type local_218;
  ActionMessage local_208;
  reference local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_140;
  undefined1 *local_138;
  undefined1 local_130 [24];
  undefined4 local_118;
  undefined4 local_114;
  pair<helics::action_message_def::action_t,_helics::action_message_def::action_t> local_110;
  BaseType local_108;
  BaseType local_104;
  ushort local_52;
  reference local_50;
  pair<helics::GlobalHandle,_unsigned_short> *local_48;
  __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
  local_40;
  undefined1 *local_38;
  undefined1 local_30 [32];
  UnknownHandleManager *local_10;
  
  local_10 = in_RSI;
  UnknownHandleManager::checkForFilters
            ((UnknownHandleManager *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
             (string *)in_stack_fffffffffffffba0);
  local_38 = local_30;
  local_40._M_current =
       (pair<helics::GlobalHandle,_unsigned_short> *)
       CLI::std::
       vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
       ::begin((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                *)in_stack_fffffffffffffb98);
  local_48 = (pair<helics::GlobalHandle,_unsigned_short> *)
             CLI::std::
             vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             ::end((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                    *)in_stack_fffffffffffffb98);
  while (bVar1 = __gnu_cxx::
                 operator==<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                           ((__normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                             *)in_stack_fffffffffffffba0,
                            (__normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                             *)in_stack_fffffffffffffb98), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_50 = __gnu_cxx::
               __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
               ::operator*(&local_40);
    local_52 = local_50->second;
    bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::FilterFlags>
                      ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                        *)local_10,clone_flag);
    if (bVar1) {
      uVar3 = make_flags(9);
      local_52 = local_52 | uVar3;
    }
    local_104 = (local_50->first).fed_id.gid;
    local_108 = (local_50->first).handle.hid;
    in_stack_fffffffffffffbc0 = local_10;
    BasicHandleInfo::BasicHandleInfo
              ((BasicHandleInfo *)
               CONCAT17(in_stack_fffffffffffffbbf,
                        CONCAT16(in_stack_fffffffffffffbbe,
                                 CONCAT24(in_stack_fffffffffffffbbc,
                                          CONCAT13(in_stack_fffffffffffffbbb,
                                                   CONCAT12(in_stack_fffffffffffffbba,
                                                            in_stack_fffffffffffffbb8))))),
               (GlobalFederateId)(BaseType)((ulong)local_10 >> 0x20),
               (InterfaceHandle)(BaseType)local_10,in_stack_fffffffffffffbb0.second._3_1_);
    local_114 = 0x3e;
    local_118 = 0x5a;
    local_110 = std::
                make_pair<helics::action_message_def::action_t,helics::action_message_def::action_t>
                          ((action_t *)in_stack_fffffffffffffb98,(action_t *)0x6055c6);
    connectInterfaces((CoreBroker *)in_stack_fffffffffffffd18.internalTimeCode,
                      (BasicHandleInfo *)in_stack_fffffffffffffd10.internalTimeCode,
                      in_stack_fffffffffffffd0c,in_stack_fffffffffffffd00,
                      in_stack_fffffffffffffcfc.hid,in_stack_fffffffffffffd20);
    BasicHandleInfo::~BasicHandleInfo((BasicHandleInfo *)in_stack_fffffffffffffba0);
    __gnu_cxx::
    __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
    ::operator++(&local_40);
  }
  UnknownHandleManager::checkForFilterDestTargets
            ((UnknownHandleManager *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
             (string *)in_stack_fffffffffffffba0);
  local_138 = local_130;
  local_140._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb98);
  local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffb98);
  while (bVar1 = __gnu_cxx::
                 operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffba0,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb98), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_150 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_140);
    ActionMessage::ActionMessage
              ((ActionMessage *)in_stack_fffffffffffffbc0,
               CONCAT13(in_stack_fffffffffffffbbf,
                        CONCAT12(in_stack_fffffffffffffbbe,in_stack_fffffffffffffbbc)));
    local_218 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffba0);
    name._M_str = (char *)in_stack_fffffffffffffba0;
    name._M_len = (size_t)in_stack_fffffffffffffb98;
    ActionMessage::name((ActionMessage *)0x605729,name);
    local_220 = (GlobalHandle)(local_10->unknown_publications)._M_h._M_buckets;
    ActionMessage::setSource(&local_208,local_220);
    local_208.flags =
         *(uint16_t *)
          ((long)&((InterfaceHandle *)
                  ((GlobalFederateId *)&(local_10->unknown_publications)._M_h._M_bucket_count + 1))
                  ->hid + 2);
    setActionFlag<helics::ActionMessage,helics::InterfaceFlags>(&local_208,destination_target);
    in_stack_fffffffffffffbbf =
         checkActionFlag<helics::BasicHandleInfo,helics::FilterFlags>
                   ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)
                    local_10,clone_flag);
    if ((bool)in_stack_fffffffffffffbbf) {
      setActionFlag<helics::ActionMessage,helics::FilterFlags>(&local_208,clone_flag);
    }
    checkForNamedInterface(unaff_retaddr,in_RDI);
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffba0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_140);
  }
  UnknownHandleManager::checkForFilterSourceTargets
            ((UnknownHandleManager *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
             (string *)in_stack_fffffffffffffba0);
  local_240 = local_238;
  local_248._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_fffffffffffffb98);
  while (bVar1 = __gnu_cxx::
                 operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffba0,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb98), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_248);
    ActionMessage::ActionMessage
              ((ActionMessage *)in_stack_fffffffffffffbc0,
               CONCAT13(in_stack_fffffffffffffbbf,
                        CONCAT12(in_stack_fffffffffffffbbe,in_stack_fffffffffffffbbc)));
    local_320 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffba0);
    name_00._M_str = (char *)in_stack_fffffffffffffba0;
    name_00._M_len = (size_t)in_stack_fffffffffffffb98;
    ActionMessage::name((ActionMessage *)0x605907,name_00);
    local_328 = (GlobalHandle)(local_10->unknown_publications)._M_h._M_buckets;
    ActionMessage::setSource((ActionMessage *)&stack0xfffffffffffffcf0,local_328);
    in_stack_fffffffffffffbbe =
         checkActionFlag<helics::BasicHandleInfo,helics::FilterFlags>
                   ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)
                    local_10,clone_flag);
    if ((bool)in_stack_fffffffffffffbbe) {
      setActionFlag<helics::ActionMessage,helics::FilterFlags>
                ((ActionMessage *)&stack0xfffffffffffffcf0,clone_flag);
    }
    checkForNamedInterface(unaff_retaddr,in_RDI);
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffba0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_248);
  }
  bVar1 = CLI::std::
          vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
          ::empty((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                   *)in_stack_fffffffffffffbb0);
  if (((!bVar1) ||
      (bVar1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffbb0), !bVar1)) ||
     (bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffbb0), !bVar1)) {
    UnknownHandleManager::clearFilter(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  }
  BVar4 = BrokerBase::getBrokerState((BrokerBase *)0x605a53);
  if (BVar4 == OPERATING) {
    UnknownHandleManager::checkForFilters
              ((UnknownHandleManager *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
               ,(string *)in_stack_fffffffffffffba0);
    CLI::std::
    vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::operator=((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                 *)in_stack_fffffffffffffbb0,
                (vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                 *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    CLI::std::
    vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::~vector((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
               *)in_stack_fffffffffffffbb0);
    local_348 = local_30;
    local_350._M_current =
         (pair<helics::GlobalHandle,_unsigned_short> *)
         CLI::std::
         vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
         ::begin((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                  *)in_stack_fffffffffffffb98);
    CLI::std::
    vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::end((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
           *)in_stack_fffffffffffffb98);
    while (bVar1 = __gnu_cxx::
                   operator==<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                             ((__normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                               *)in_stack_fffffffffffffba0,
                              (__normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                               *)in_stack_fffffffffffffb98), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
      ::operator*(&local_350);
      type_of_handle = in_stack_fffffffffffffbb0.second._3_1_;
      uVar2 = checkActionFlag<helics::BasicHandleInfo,helics::FilterFlags>
                        ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                          *)local_10,clone_flag);
      if ((bool)uVar2) {
        in_stack_fffffffffffffbb8 = make_flags(9);
      }
      in_stack_fffffffffffffba0 = local_10;
      BasicHandleInfo::BasicHandleInfo
                ((BasicHandleInfo *)
                 CONCAT17(in_stack_fffffffffffffbbf,
                          CONCAT16(in_stack_fffffffffffffbbe,
                                   CONCAT24(BVar4,CONCAT13(uVar2,CONCAT12(in_stack_fffffffffffffbba,
                                                                          in_stack_fffffffffffffbb8)
                                                          )))),
                 (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffbc0 >> 0x20),
                 (InterfaceHandle)(BaseType)in_stack_fffffffffffffbc0,type_of_handle);
      in_stack_fffffffffffffbb0 =
           std::make_pair<helics::action_message_def::action_t,helics::action_message_def::action_t>
                     ((action_t *)in_stack_fffffffffffffb98,(action_t *)0x605bf6);
      connectInterfaces((CoreBroker *)in_stack_fffffffffffffd18.internalTimeCode,
                        (BasicHandleInfo *)in_stack_fffffffffffffd10.internalTimeCode,
                        in_stack_fffffffffffffd0c,in_stack_fffffffffffffd00,
                        in_stack_fffffffffffffcfc.hid,in_stack_fffffffffffffd20);
      BasicHandleInfo::~BasicHandleInfo((BasicHandleInfo *)in_stack_fffffffffffffba0);
      __gnu_cxx::
      __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
      ::operator++(&local_350);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffbb0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffbb0);
  CLI::std::
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  ::~vector((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             *)in_stack_fffffffffffffbb0);
  return;
}

Assistant:

void CoreBroker::findAndNotifyFilterTargets(BasicHandleInfo& handleInfo, const std::string& key)
{
    auto Handles = unknownHandles.checkForFilters(key);
    for (const auto& target : Handles) {
        auto flags = target.second;
        if (checkActionFlag(handleInfo, clone_flag)) {
            flags |= make_flags(clone_flag);
        }
        connectInterfaces(handleInfo,
                          flags,
                          BasicHandleInfo(target.first.fed_id,
                                          target.first.handle,
                                          InterfaceType::ENDPOINT),

                          flags,
                          std::make_pair(CMD_ADD_FILTER, CMD_ADD_ENDPOINT));
    }

    auto FiltDestTargets = unknownHandles.checkForFilterDestTargets(key);
    for (const auto& target : FiltDestTargets) {
        ActionMessage link(CMD_ADD_NAMED_ENDPOINT);
        link.name(target);
        link.setSource(handleInfo.handle);
        link.flags = handleInfo.flags;
        setActionFlag(link, destination_target);
        if (checkActionFlag(handleInfo, clone_flag)) {
            setActionFlag(link, clone_flag);
        }
        checkForNamedInterface(link);
    }

    auto FiltSourceTargets = unknownHandles.checkForFilterSourceTargets(key);
    for (const auto& target : FiltSourceTargets) {
        ActionMessage link(CMD_ADD_NAMED_ENDPOINT);
        link.name(target);
        link.flags = handleInfo.flags;
        link.setSource(handleInfo.handle);
        if (checkActionFlag(handleInfo, clone_flag)) {
            setActionFlag(link, clone_flag);
        }
        checkForNamedInterface(link);
    }
    if (!(Handles.empty() && FiltDestTargets.empty() && FiltSourceTargets.empty())) {
        unknownHandles.clearFilter(key);
    }
    if (getBrokerState() == BrokerState::OPERATING) {
        Handles = unknownHandles.checkForFilters(key);
        for (const auto& target : Handles) {
            auto flags = target.second;
            if (checkActionFlag(handleInfo, clone_flag)) {
                flags |= make_flags(clone_flag);
            }
            connectInterfaces(handleInfo,
                              flags,
                              BasicHandleInfo(target.first.fed_id,
                                              target.first.handle,
                                              InterfaceType::ENDPOINT),

                              flags,
                              std::make_pair(CMD_ADD_FILTER, CMD_ADD_ENDPOINT));
        }
    }
}